

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O2

string * __thiscall
lzstring::LZString::CompressToBase64(string *__return_storage_ptr__,LZString *this,wstring *input)

{
  char *__rhs;
  string res;
  wstring tmp;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if (input->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<wchar_t_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/243286065[P]lz-string-cpp/LZString.cpp:36:40)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<wchar_t_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/243286065[P]lz-string-cpp/LZString.cpp:36:40)>
             ::_M_manager;
  Compress(&tmp,this,input,6,(GetCharFromIntFunc *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  to_string(&res,&tmp);
  switch((uint)res._M_string_length & 3) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res._M_dataplus._M_p == &res.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = res.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = res._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(res.field_2._M_allocated_capacity._1_7_,res.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = res._M_string_length;
    res._M_string_length = 0;
    res.field_2._M_local_buf[0] = '\0';
    res._M_dataplus._M_p = (pointer)&res.field_2;
    goto LAB_00109cb5;
  case 1:
    __rhs = "===";
    break;
  case 2:
    __rhs = "==";
    break;
  case 3:
    __rhs = "=";
  }
  std::operator+(__return_storage_ptr__,&res,__rhs);
LAB_00109cb5:
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::wstring::~wstring((wstring *)&tmp);
  return __return_storage_ptr__;
}

Assistant:

std::string LZString::CompressToBase64(const std::wstring &input)
{
	if (input.empty())
		return std::string();

	std::wstring tmp = Compress(input, 6, [](int code) { return kKeyStrBase64[code]; });
	std::string res = to_string(tmp);
	switch (res.size() % 4)
	{
	case 0:
		return res;
	case 1:
		return res + "===";
	case 2:
		return res + "==";
	case 3:
		return res + "=";
	default:
		return "";
	}
}